

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void select_colors(j_decompress_ptr cinfo,int desired_colors)

{
  int iVar1;
  boxptr boxp;
  int in_ESI;
  j_decompress_ptr in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int i;
  int numboxes;
  boxptr boxlist;
  int local_20;
  
  boxp = (boxptr)(*in_RDI->mem->alloc_small)((j_common_ptr)in_RDI,1,(long)in_ESI * 0x28);
  boxp->c0min = 0;
  boxp->c0max = 0x1f;
  boxp->c1min = 0;
  boxp->c1max = 0x3f;
  boxp->c2min = 0;
  boxp->c2max = 0x1f;
  update_box(in_RDI,boxp);
  iVar1 = median_cut((j_decompress_ptr)boxlist,_i,unaff_retaddr_00,unaff_retaddr);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    compute_color(in_RDI,boxp + local_20,local_20);
  }
  in_RDI->actual_number_of_colors = iVar1;
  in_RDI->err->msg_code = 0x60;
  (in_RDI->err->msg_parm).i[0] = iVar1;
  (*in_RDI->err->emit_message)((j_common_ptr)in_RDI,1);
  return;
}

Assistant:

LOCAL(void)
select_colors(j_decompress_ptr cinfo, int desired_colors)
/* Master routine for color selection */
{
  boxptr boxlist;
  int numboxes;
  int i;

  /* Allocate workspace for box list */
  boxlist = (boxptr)(*cinfo->mem->alloc_small)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, desired_colors * sizeof(box));
  /* Initialize one box containing whole space */
  numboxes = 1;
  boxlist[0].c0min = 0;
  boxlist[0].c0max = MAXJSAMPLE >> C0_SHIFT;
  boxlist[0].c1min = 0;
  boxlist[0].c1max = MAXJSAMPLE >> C1_SHIFT;
  boxlist[0].c2min = 0;
  boxlist[0].c2max = MAXJSAMPLE >> C2_SHIFT;
  /* Shrink it to actually-used volume and set its statistics */
  update_box(cinfo, &boxlist[0]);
  /* Perform median-cut to produce final box list */
  numboxes = median_cut(cinfo, boxlist, numboxes, desired_colors);
  /* Compute the representative color for each box, fill colormap */
  for (i = 0; i < numboxes; i++)
    compute_color(cinfo, &boxlist[i], i);
  cinfo->actual_number_of_colors = numboxes;
  TRACEMS1(cinfo, 1, JTRC_QUANT_SELECTED, numboxes);
}